

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTriangles.cpp
# Opt level: O0

IterateResult __thiscall
glcts::TessellationShaderTrianglesDegenerateTriangle::iterate
          (TessellationShaderTrianglesDegenerateTriangle *this)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  NotSupportedError *this_00;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  TestError *pTVar5;
  TestLog *this_01;
  MessageBuilder *pMVar6;
  float fVar7;
  MessageBuilder local_210;
  float *local_90;
  float *triangle_ptr;
  byte local_7f;
  byte local_7e;
  byte local_7d;
  uint n_vertex;
  bool is_one_zero_zero_present;
  bool is_zero_one_zero_present;
  bool is_zero_zero_one_present;
  float *pfStack_78;
  float epsilon;
  float *triangle_vertex_data;
  _test_descriptor *test;
  __normal_iterator<glcts::TessellationShaderTrianglesDegenerateTriangle::_test_descriptor_*,_std::vector<glcts::TessellationShaderTrianglesDegenerateTriangle::_test_descriptor,_std::allocator<glcts::TessellationShaderTrianglesDegenerateTriangle::_test_descriptor>_>_>
  local_60;
  __normal_iterator<const_glcts::TessellationShaderTrianglesDegenerateTriangle::_test_descriptor_*,_std::vector<glcts::TessellationShaderTrianglesDegenerateTriangle::_test_descriptor,_std::allocator<glcts::TessellationShaderTrianglesDegenerateTriangle::_test_descriptor>_>_>
  local_58;
  _tests_const_iterator test_iterator;
  Functions *gl;
  allocator<char> local_31;
  string local_30;
  TessellationShaderTrianglesDegenerateTriangle *local_10;
  TessellationShaderTrianglesDegenerateTriangle *this_local;
  
  local_10 = this;
  if (((this->super_TestCaseBase).m_is_tessellation_shader_supported & 1U) == 0) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"Tessellation shader functionality not supported, skipping",
               &local_31);
    tcu::NotSupportedError::NotSupportedError(this_00,&local_30);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  initTest(this);
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  test_iterator._M_current = (_test_descriptor *)CONCAT44(extraout_var,iVar2);
  (**(code **)(test_iterator._M_current + 0x152))
            ((this->super_TestCaseBase).m_glExtTokens.PATCH_VERTICES,1);
  dVar3 = (**(code **)&test_iterator._M_current[0xaa].vertex_spacing)();
  glu::checkError(dVar3,"glPatchParameteriEXT() failed for GL_PATCH_VERTICES_EXT pname",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTriangles.cpp"
                  ,0x1a6);
  local_60._M_current =
       (_test_descriptor *)
       std::
       vector<glcts::TessellationShaderTrianglesDegenerateTriangle::_test_descriptor,_std::allocator<glcts::TessellationShaderTrianglesDegenerateTriangle::_test_descriptor>_>
       ::begin(&this->m_tests);
  __gnu_cxx::
  __normal_iterator<glcts::TessellationShaderTrianglesDegenerateTriangle::_test_descriptor_const*,std::vector<glcts::TessellationShaderTrianglesDegenerateTriangle::_test_descriptor,std::allocator<glcts::TessellationShaderTrianglesDegenerateTriangle::_test_descriptor>>>
  ::__normal_iterator<glcts::TessellationShaderTrianglesDegenerateTriangle::_test_descriptor*>
            ((__normal_iterator<glcts::TessellationShaderTrianglesDegenerateTriangle::_test_descriptor_const*,std::vector<glcts::TessellationShaderTrianglesDegenerateTriangle::_test_descriptor,std::allocator<glcts::TessellationShaderTrianglesDegenerateTriangle::_test_descriptor>>>
              *)&local_58,&local_60);
  do {
    test = (_test_descriptor *)
           std::
           vector<glcts::TessellationShaderTrianglesDegenerateTriangle::_test_descriptor,_std::allocator<glcts::TessellationShaderTrianglesDegenerateTriangle::_test_descriptor>_>
           ::end(&this->m_tests);
    bVar1 = __gnu_cxx::operator!=
                      (&local_58,
                       (__normal_iterator<glcts::TessellationShaderTrianglesDegenerateTriangle::_test_descriptor_*,_std::vector<glcts::TessellationShaderTrianglesDegenerateTriangle::_test_descriptor,_std::allocator<glcts::TessellationShaderTrianglesDegenerateTriangle::_test_descriptor>_>_>
                        *)&test);
    if (!bVar1) {
      tcu::TestContext::setTestResult
                ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_PASS,"Pass");
      return STOP;
    }
    triangle_vertex_data =
         (float *)__gnu_cxx::
                  __normal_iterator<const_glcts::TessellationShaderTrianglesDegenerateTriangle::_test_descriptor_*,_std::vector<glcts::TessellationShaderTrianglesDegenerateTriangle::_test_descriptor,_std::allocator<glcts::TessellationShaderTrianglesDegenerateTriangle::_test_descriptor>_>_>
                  ::operator*(&local_58);
    (**(code **)(test_iterator._M_current + 0x1e0))(((reference)triangle_vertex_data)->po_id);
    dVar3 = (**(code **)&test_iterator._M_current[0xaa].vertex_spacing)();
    glu::checkError(dVar3,"glUseProgram() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTriangles.cpp"
                    ,0x1af);
    (**(code **)(test_iterator._M_current + 4))(4);
    dVar3 = (**(code **)&test_iterator._M_current[0xaa].vertex_spacing)();
    glu::checkError(dVar3,"glBeginTransformFeedback(GL_TRIANGLES) failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTriangles.cpp"
                    ,0x1b3);
    (**(code **)&test_iterator._M_current[0x6f].te_id)
              ((this->super_TestCaseBase).m_glExtTokens.PATCHES,0,1);
    dVar3 = (**(code **)&test_iterator._M_current[0xaa].vertex_spacing)();
    glu::checkError(dVar3,"glDrawArrays() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTriangles.cpp"
                    ,0x1b6);
    (**(code **)&test_iterator._M_current[0x84].vertex_spacing)();
    dVar3 = (**(code **)&test_iterator._M_current[0xaa].vertex_spacing)();
    glu::checkError(dVar3,"glEndTransformFeedback() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTriangles.cpp"
                    ,0x1b9);
    pfStack_78 = (float *)(**(code **)&test_iterator._M_current[0x115].te_id)(0x8c8e,0,0x24,1);
    dVar3 = (**(code **)&test_iterator._M_current[0xaa].vertex_spacing)();
    glu::checkError(dVar3,"glMapBufferRange() call failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTriangles.cpp"
                    ,0x1c0);
    n_vertex = 0x3727c5ac;
    local_7d = 0;
    local_7e = 0;
    local_7f = 0;
    for (triangle_ptr._4_4_ = 0; triangle_ptr._4_4_ < 3; triangle_ptr._4_4_ = triangle_ptr._4_4_ + 1
        ) {
      local_90 = pfStack_78 + triangle_ptr._4_4_ * 3;
      fVar7 = de::abs<float>(*local_90);
      if (((1e-05 <= fVar7) || (fVar7 = de::abs<float>(local_90[1]), 1e-05 <= fVar7)) ||
         (fVar7 = de::abs<float>(local_90[2] - 1.0), 1e-05 <= fVar7)) {
        fVar7 = de::abs<float>(*local_90);
        if (((1e-05 <= fVar7) || (fVar7 = de::abs<float>(local_90[1] - 1.0), 1e-05 <= fVar7)) ||
           (fVar7 = de::abs<float>(local_90[2]), 1e-05 <= fVar7)) {
          fVar7 = de::abs<float>(*local_90 - 1.0);
          if (((1e-05 <= fVar7) || (fVar7 = de::abs<float>(local_90[1]), 1e-05 <= fVar7)) ||
             (fVar7 = de::abs<float>(local_90[2]), 1e-05 <= fVar7)) {
            this_01 = tcu::TestContext::getLog
                                ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)
            ;
            tcu::TestLog::operator<<(&local_210,this_01,(BeginMessageToken *)&tcu::TestLog::Message)
            ;
            pMVar6 = tcu::MessageBuilder::operator<<(&local_210,(char (*) [18])"Unexpected vertex");
            pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2b0b32e);
            pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,pfStack_78);
            pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2a4b1eb);
            pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,pfStack_78 + 1);
            pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2a4b1eb);
            pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,pfStack_78 + 2);
            pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2a94734);
            pMVar6 = tcu::MessageBuilder::operator<<
                               (pMVar6,(char (*) [40])" encountered for a degenerate triangle.");
            tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder(&local_210);
            pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar5,"Invalid vertex was generated by the tessellator",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTriangles.cpp"
                       ,0x1f9);
            __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
          }
          if ((local_7f & 1) != 0) {
            pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar5,"(1, 0, 0) vertex outputted more than once",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTriangles.cpp"
                       ,0x1ef);
            __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
          }
          local_7f = 1;
        }
        else {
          if ((local_7e & 1) != 0) {
            pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar5,"(0, 1, 0) vertex outputted more than once",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTriangles.cpp"
                       ,0x1e3);
            __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
          }
          local_7e = 1;
        }
      }
      else {
        if ((local_7d & 1) != 0) {
          pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar5,"(0, 0, 1) vertex outputted more than once",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTriangles.cpp"
                     ,0x1d7);
          __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
        local_7d = 1;
      }
    }
    (**(code **)&test_iterator._M_current[0x1de].vertex_spacing)(0x8c8e);
    dVar3 = (**(code **)&test_iterator._M_current[0xaa].vertex_spacing)();
    glu::checkError(dVar3,"glUnmapBuffer() call failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTriangles.cpp"
                    ,0x1ff);
    __gnu_cxx::
    __normal_iterator<const_glcts::TessellationShaderTrianglesDegenerateTriangle::_test_descriptor_*,_std::vector<glcts::TessellationShaderTrianglesDegenerateTriangle::_test_descriptor,_std::allocator<glcts::TessellationShaderTrianglesDegenerateTriangle::_test_descriptor>_>_>
    ::operator++(&local_58,0);
  } while( true );
}

Assistant:

tcu::TestNode::IterateResult TessellationShaderTrianglesDegenerateTriangle::iterate(void)
{
	/* Do not execute if required extensions are not supported. */
	if (!m_is_tessellation_shader_supported)
	{
		throw tcu::NotSupportedError(TESSELLATION_SHADER_EXTENSION_NOT_SUPPORTED);
	}

	/* Initialize ES test objects */
	initTest();

	/* We only need to use one vertex per so go for it */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.patchParameteri(m_glExtTokens.PATCH_VERTICES, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glPatchParameteriEXT() failed for GL_PATCH_VERTICES_EXT pname");

	/* Iterate through all tests configured */
	for (_tests_const_iterator test_iterator = m_tests.begin(); test_iterator != m_tests.end(); test_iterator++)
	{
		const _test_descriptor& test = *test_iterator;

		/* Run the iteration */
		gl.useProgram(test.po_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() failed");

		/* Draw the test geometry */
		gl.beginTransformFeedback(GL_TRIANGLES);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginTransformFeedback(GL_TRIANGLES) failed.");

		gl.drawArrays(m_glExtTokens.PATCHES, 0 /* first */, 1 /* count */);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() failed");

		gl.endTransformFeedback();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glEndTransformFeedback() failed");

		/* Map the BO with result data into user space */
		const float* triangle_vertex_data =
			(const float*)gl.mapBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0, /* offset */
											sizeof(float) * 3 /* vec3 */ * 3 /* points */, GL_MAP_READ_BIT);

		GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBufferRange() call failed");

		/* Make sure the triangle data is correct. Since we cannot rely on any specific order
		 * of the result vertices, raise corresponding flag for each of the expected vertices.
		 */
		const float epsilon					 = 1e-5f;
		bool		is_zero_zero_one_present = false;
		bool		is_zero_one_zero_present = false;
		bool		is_one_zero_zero_present = false;

		for (unsigned int n_vertex = 0; n_vertex < 3 /* vertices */; ++n_vertex)
		{
			const float* triangle_ptr = triangle_vertex_data + 3 * n_vertex;

			if (de::abs(triangle_ptr[0]) < epsilon && de::abs(triangle_ptr[1]) < epsilon &&
				de::abs(triangle_ptr[2] - 1.0f) < epsilon)
			{
				if (!is_zero_zero_one_present)
				{
					is_zero_zero_one_present = true;
				}
				else
				{
					TCU_FAIL("(0, 0, 1) vertex outputted more than once");
				}
			}
			else if (de::abs(triangle_ptr[0]) < epsilon && de::abs(triangle_ptr[1] - 1.0f) < epsilon &&
					 de::abs(triangle_ptr[2]) < epsilon)
			{
				if (!is_zero_one_zero_present)
				{
					is_zero_one_zero_present = true;
				}
				else
				{
					TCU_FAIL("(0, 1, 0) vertex outputted more than once");
				}
			}
			else if (de::abs(triangle_ptr[0] - 1.0f) < epsilon && de::abs(triangle_ptr[1]) < epsilon &&
					 de::abs(triangle_ptr[2]) < epsilon)
			{
				if (!is_one_zero_zero_present)
				{
					is_one_zero_zero_present = true;
				}
				else
				{
					TCU_FAIL("(1, 0, 0) vertex outputted more than once");
				}
			}
			else
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Unexpected vertex"
								   << " (" << triangle_vertex_data[0] << ", " << triangle_vertex_data[1] << ", "
								   << triangle_vertex_data[2] << ")"
								   << " encountered for a degenerate triangle." << tcu::TestLog::EndMessage;

				TCU_FAIL("Invalid vertex was generated by the tessellator");
			}
		} /* for (all vertices) */

		/* Unmap the BO */
		gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer() call failed");
	}

	/* All done */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}